

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::sampleTextureCubeArray
               (SurfaceAccess *dst,TextureCubeArrayView *rawSrc,Vec4 *sq,Vec4 *tq,Vec4 *rq,Vec4 *qq,
               ReferenceParams *params)

{
  LodMode lodMode;
  int iVar1;
  uint uVar2;
  float width;
  float height;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float z_;
  TextureCubeArrayView TVar8;
  float local_1d4;
  float local_1bc;
  Vector<float,_4> local_19c;
  Vector<float,_4> local_18c;
  Vec4 local_17c;
  float local_16c;
  undefined1 local_168 [4];
  float lod;
  Vec3 coordDy;
  Vec3 coordDx;
  float coordQ;
  Vec3 coord;
  float triNy;
  float triNx;
  int triNdx;
  float ny;
  float nx;
  float wy;
  float wx;
  int px;
  int py;
  float lodBias;
  Vec3 triW [2];
  undefined1 local_f8 [8];
  Vec3 triQ [2];
  undefined1 local_d8 [8];
  Vec3 triR [2];
  undefined1 local_b8 [8];
  Vec3 triT [2];
  undefined1 local_98 [8];
  Vec3 triS [2];
  float dstH;
  float dstW;
  undefined1 local_60 [8];
  TextureCubeArrayView src;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Vec4 *qq_local;
  Vec4 *rq_local;
  Vec4 *tq_local;
  Vec4 *sq_local;
  TextureCubeArrayView *rawSrc_local;
  SurfaceAccess *dst_local;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  TVar8 = tcu::getEffectiveTextureView
                    (rawSrc,(vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             *)&src.m_levels,&params->sampler);
  src._0_8_ = TVar8.m_levels;
  local_60._0_4_ = TVar8.m_numLevels;
  iVar1 = tcu::SurfaceAccess::getWidth(dst);
  width = (float)iVar1;
  iVar1 = tcu::SurfaceAccess::getHeight(dst);
  height = (float)iVar1;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_98,(int)sq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triS[0].m_data + 1),(int)sq,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_b8,(int)tq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triT[0].m_data + 1),(int)tq,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_d8,(int)rq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triR[0].m_data + 1),(int)rq,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_f8,(int)qq,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triQ[0].m_data + 1),(int)qq,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&py,(int)params + 0xc,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triW[0].m_data + 1),(int)params + 0xc,3,2);
  if (((params->super_RenderParams).flags & 2) == 0) {
    local_1bc = 0.0;
  }
  else {
    local_1bc = (params->super_RenderParams).bias;
  }
  for (wx = 0.0; iVar1 = tcu::SurfaceAccess::getHeight(dst), (int)wx < iVar1;
      wx = (float)((int)wx + 1)) {
    for (wy = 0.0; iVar1 = tcu::SurfaceAccess::getWidth(dst), (int)wy < iVar1;
        wy = (float)((int)wy + 1)) {
      fVar3 = (float)(int)wy + 0.5;
      fVar4 = (float)(int)wx + 0.5;
      fVar5 = fVar3 / width;
      local_1d4 = fVar4 / height;
      uVar2 = (uint)(1.0 <= fVar5 + local_1d4);
      if (uVar2 != 0) {
        fVar5 = 1.0 - fVar5;
        local_1d4 = 1.0 - local_1d4;
      }
      fVar6 = triangleInterpolate((Vec3 *)(triS[(long)(int)uVar2 + -1].m_data + 1),fVar5,local_1d4);
      fVar7 = triangleInterpolate((Vec3 *)(triT[(long)(int)uVar2 + -1].m_data + 1),fVar5,local_1d4);
      z_ = triangleInterpolate((Vec3 *)(triR[(long)(int)uVar2 + -1].m_data + 1),fVar5,local_1d4);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(coordDx.m_data + 2),fVar6,fVar7,z_);
      coordDx.m_data[1] =
           triangleInterpolate((Vec3 *)(triQ[(long)(int)uVar2 + -1].m_data + 1),fVar5,local_1d4);
      fVar6 = triDerivateX((Vec3 *)(triS[(long)(int)uVar2 + -1].m_data + 1),
                           (Vec3 *)(&py + (long)(int)uVar2 * 3),fVar3,width,local_1d4);
      fVar7 = triDerivateX((Vec3 *)(triT[(long)(int)uVar2 + -1].m_data + 1),
                           (Vec3 *)(&py + (long)(int)uVar2 * 3),fVar3,width,local_1d4);
      fVar3 = triDerivateX((Vec3 *)(triR[(long)(int)uVar2 + -1].m_data + 1),
                           (Vec3 *)(&py + (long)(int)uVar2 * 3),fVar3,width,local_1d4);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(coordDy.m_data + 1),fVar6,fVar7,fVar3);
      fVar3 = triDerivateY((Vec3 *)(triS[(long)(int)uVar2 + -1].m_data + 1),
                           (Vec3 *)(&py + (long)(int)uVar2 * 3),fVar4,height,fVar5);
      fVar6 = triDerivateY((Vec3 *)(triT[(long)(int)uVar2 + -1].m_data + 1),
                           (Vec3 *)(&py + (long)(int)uVar2 * 3),fVar4,height,fVar5);
      fVar5 = triDerivateY((Vec3 *)(triR[(long)(int)uVar2 + -1].m_data + 1),
                           (Vec3 *)(&py + (long)(int)uVar2 * 3),fVar4,height,fVar5);
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_168,fVar3,fVar6,fVar5);
      lodMode = params->lodMode;
      iVar1 = tcu::TextureCubeArrayView::getSize((TextureCubeArrayView *)local_60);
      fVar5 = computeCubeLodFromDerivates
                        (lodMode,(Vec3 *)(coordDx.m_data + 2),(Vec3 *)(coordDy.m_data + 1),
                         (Vec3 *)local_168,iVar1);
      local_16c = de::clamp<float>(fVar5 + local_1bc,params->minLod,params->maxLod);
      fVar5 = tcu::Vector<float,_3>::x((Vector<float,_3> *)(coordDx.m_data + 2));
      fVar3 = tcu::Vector<float,_3>::y((Vector<float,_3> *)(coordDx.m_data + 2));
      fVar4 = tcu::Vector<float,_3>::z((Vector<float,_3> *)(coordDx.m_data + 2));
      execSample((TextureTestUtil *)&local_19c,(TextureCubeArrayView *)local_60,params,fVar5,fVar3,
                 fVar4,coordDx.m_data[1],local_16c);
      tcu::operator*((tcu *)&local_18c,&local_19c,&(params->super_RenderParams).colorScale);
      tcu::operator+((tcu *)&local_17c,&local_18c,&(params->super_RenderParams).colorBias);
      tcu::SurfaceAccess::setPixel(dst,&local_17c,(int)wy,(int)wx);
    }
  }
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::~vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  return;
}

Assistant:

static void sampleTextureCubeArray (const tcu::SurfaceAccess& dst, const tcu::TextureCubeArrayView& rawSrc, const tcu::Vec4& sq, const tcu::Vec4& tq, const tcu::Vec4& rq, const tcu::Vec4& qq, const ReferenceParams& params)
{
	// Separate combined DS formats
	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::TextureCubeArrayView				src					= getEffectiveTextureView(rawSrc, srcLevelStorage, params.sampler);

	const float									dstW				= (float)dst.getWidth();
	const float									dstH				= (float)dst.getHeight();

	// Coordinates per triangle.
	tcu::Vec3									triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	tcu::Vec3									triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	tcu::Vec3									triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	tcu::Vec3									triQ[2]				= { qq.swizzle(0, 1, 2), qq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { params.w.swizzle(0, 1, 2), params.w.swizzle(3, 2, 1) };

	const float									lodBias				= (params.flags & ReferenceParams::USE_BIAS) ? params.bias : 0.0f;

	for (int py = 0; py < dst.getHeight(); py++)
	{
		for (int px = 0; px < dst.getWidth(); px++)
		{
			const float		wx		= (float)px + 0.5f;
			const float		wy		= (float)py + 0.5f;
			const float		nx		= wx / dstW;
			const float		ny		= wy / dstH;

			const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
			const float		triNx	= triNdx ? 1.0f - nx : nx;
			const float		triNy	= triNdx ? 1.0f - ny : ny;

			const tcu::Vec3	coord	(triangleInterpolate(triS[triNdx], triNx, triNy),
									 triangleInterpolate(triT[triNdx], triNx, triNy),
									 triangleInterpolate(triR[triNdx], triNx, triNy));

			const float		coordQ	= triangleInterpolate(triQ[triNdx], triNx, triNy);

			const tcu::Vec3	coordDx	(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
									 triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
									 triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy));
			const tcu::Vec3	coordDy	(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
									 triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
									 triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx));

			const float		lod		= de::clamp(computeCubeLodFromDerivates(params.lodMode, coord, coordDx, coordDy, src.getSize()) + lodBias, params.minLod, params.maxLod);

			dst.setPixel(execSample(src, params, coord.x(), coord.y(), coord.z(), coordQ, lod) * params.colorScale + params.colorBias, px, py);
		}
	}
}